

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bspatch.c
# Opt level: O0

int bspatch(uint8_t *source,int64_t sourcesize,uint8_t *target,int64_t targetsize,
           bspatch_stream *stream)

{
  int iVar1;
  int64_t iVar2;
  long local_70;
  int64_t i;
  int64_t ctrl [3];
  int64_t newpos;
  int64_t oldpos;
  uint8_t buf [8];
  bspatch_stream *stream_local;
  int64_t targetsize_local;
  uint8_t *target_local;
  int64_t sourcesize_local;
  uint8_t *source_local;
  
  newpos = 0;
  ctrl[2] = 0;
  buf = (uint8_t  [8])stream;
  while( true ) {
    if (targetsize <= ctrl[2]) {
      return 0;
    }
    for (local_70 = 0; local_70 < 3; local_70 = local_70 + 1) {
      iVar1 = (**(code **)((long)buf + 8))(buf,&oldpos,8);
      if (iVar1 != 0) {
        return -1;
      }
      iVar2 = offtin((uint8_t *)&oldpos);
      ctrl[local_70 + -1] = iVar2;
    }
    if (targetsize < ctrl[2] + i) {
      return -1;
    }
    iVar1 = (**(code **)((long)buf + 8))(buf,target + ctrl[2],i & 0xffffffff);
    if (iVar1 != 0) {
      return -1;
    }
    for (local_70 = 0; local_70 < i; local_70 = local_70 + 1) {
      if ((-1 < newpos + local_70) && (newpos + local_70 < sourcesize)) {
        target[ctrl[2] + local_70] = target[ctrl[2] + local_70] + source[newpos + local_70];
      }
    }
    ctrl[2] = i + ctrl[2];
    if (targetsize < ctrl[2] + ctrl[0]) break;
    iVar1 = (**(code **)((long)buf + 8))(buf,target + ctrl[2],ctrl[0] & 0xffffffff);
    if (iVar1 != 0) {
      return -1;
    }
    ctrl[2] = ctrl[0] + ctrl[2];
    newpos = ctrl[1] + i + newpos;
  }
  return -1;
}

Assistant:

int bspatch(const uint8_t* source, int64_t sourcesize, uint8_t* target, int64_t targetsize, struct bspatch_stream* stream)
{
	uint8_t buf[8];
	int64_t oldpos,newpos;
	int64_t ctrl[3];
	int64_t i;

	oldpos=0;newpos=0;
	while(newpos<targetsize) {
		/* Read control data */
		for(i=0;i<=2;i++) {
			if (stream->read(stream, buf, 8))
				return -1;
			ctrl[i]=offtin(buf);
		};

		/* Sanity-check */
		if(newpos+ctrl[0]>targetsize)
			return -1;

		/* Read diff string */
		if (stream->read(stream, target + newpos, ctrl[0]))
			return -1;

		/* Add old data to diff string */
		for(i=0;i<ctrl[0];i++)
			if((oldpos+i>=0) && (oldpos+i<sourcesize))
				target[newpos+i]+=source[oldpos+i];

		/* Adjust pointers */
		newpos+=ctrl[0];
		oldpos+=ctrl[0];

		/* Sanity-check */
		if(newpos+ctrl[1]>targetsize)
			return -1;

		/* Read extra string */
		if (stream->read(stream, target + newpos, ctrl[1]))
			return -1;

		/* Adjust pointers */
		newpos+=ctrl[1];
		oldpos+=ctrl[2];
	};

	return 0;
}